

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBoneAssignment(OgreBinarySerializer *this,VertexData *dest)

{
  pointer *ppVVar1;
  iterator __position;
  unsigned_short uVar2;
  runtime_error *this_00;
  VertexBoneAssignment ba;
  VertexBoneAssignment local_40;
  undefined1 local_30 [16];
  
  if (dest != (VertexData *)0x0) {
    local_40.vertexIndex = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
    local_40.boneIndex = uVar2;
    local_40.weight = StreamReader<false,_false>::Get<float>(this->m_reader);
    __position._M_current =
         (dest->super_IVertexData).boneAssignments.
         super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (dest->super_IVertexData).boneAssignments.
        super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>
      ::_M_realloc_insert<Assimp::Ogre::VertexBoneAssignment_const&>
                ((vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>
                  *)&(dest->super_IVertexData).boneAssignments,__position,&local_40);
    }
    else {
      (__position._M_current)->weight = local_40.weight;
      (__position._M_current)->vertexIndex = local_40.vertexIndex;
      (__position._M_current)->boneIndex = local_40.boneIndex;
      *(undefined2 *)&(__position._M_current)->field_0x6 = local_40._6_2_;
      ppVVar1 = &(dest->super_IVertexData).boneAssignments.
                 super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40._0_8_ = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot read bone assignments, vertex data is null.","");
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadBoneAssignment(VertexData *dest)
{
    if (!dest) {
        throw DeadlyImportError("Cannot read bone assignments, vertex data is null.");
    }

    VertexBoneAssignment ba;
    ba.vertexIndex = Read<uint32_t>();
    ba.boneIndex = Read<uint16_t>();
    ba.weight = Read<float>();

    dest->boneAssignments.push_back(ba);
}